

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmConditionEvaluator.cxx
# Opt level: O2

bool __thiscall
anon_unknown.dwarf_191a19a::looksLikeSpecialVariable
          (anon_unknown_dwarf_191a19a *this,string *var,static_string_view prefix,size_t varNameLen)

{
  char *pcVar1;
  size_t sVar2;
  bool bVar3;
  string_view str;
  string_view prefix_00;
  char local_59;
  static_string_view local_58;
  string local_48;
  
  local_58.super_string_view._M_str = (char *)prefix.super_string_view._M_len;
  if (prefix.super_string_view._M_str < (char *)((long)&(var->_M_dataplus)._M_p + 3)) {
    bVar3 = false;
  }
  else {
    pcVar1 = *(char **)this;
    sVar2 = *(size_t *)(this + 8);
    local_59 = '{';
    local_58.super_string_view._M_len = (size_t)var;
    cmStrCat<cm::static_string_view&,char>(&local_48,&local_58,&local_59);
    str._M_str = pcVar1;
    str._M_len = sVar2;
    prefix_00._M_str = local_48._M_dataplus._M_p;
    prefix_00._M_len = local_48._M_string_length;
    bVar3 = cmHasPrefix(str,prefix_00);
    if (bVar3) {
      bVar3 = prefix.super_string_view._M_str[*(long *)this + -1] == '}';
    }
    else {
      bVar3 = false;
    }
    std::__cxx11::string::~string((string *)&local_48);
  }
  return bVar3;
}

Assistant:

bool looksLikeSpecialVariable(const std::string& var,
                              cm::static_string_view prefix,
                              const std::size_t varNameLen)
{
  // NOTE Expecting a variable name at least 1 char length:
  // <prefix> + `{` + <varname> + `}`
  return ((prefix.size() + 3) <= varNameLen) &&
    cmHasPrefix(var, cmStrCat(prefix, '{')) && var[varNameLen - 1] == '}';
}